

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_fs_open(void)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  undefined8 uVar4;
  uv_process_t *tcp;
  uv_buf_t *buf;
  ulong unaff_RBX;
  undefined1 *puVar5;
  anon_union_8_2_26168aa3_for_data aVar6;
  uv_process_t *puVar7;
  code *nread;
  uv_timer_t *puVar8;
  undefined1 auVar9 [16];
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  char dev_null [10];
  uv_stdio_container_t stdio [1];
  uv_pipe_t in;
  uv_fs_t fs_req;
  uv_write_t write_req2;
  uv_write_t write_req;
  undefined1 auStack_7b0 [24];
  uv_stdio_container_t uStack_798;
  undefined4 uStack_788;
  undefined4 uStack_778;
  uv_stream_t uStack_768;
  uv_stream_t uStack_660;
  code *pcStack_4a8;
  code *pcStack_4a0;
  int local_490;
  int local_48c;
  undefined1 local_488 [16];
  undefined8 local_478;
  undefined2 local_470;
  uv_stdio_container_t local_468;
  undefined1 local_458 [264];
  undefined1 local_350 [88];
  undefined4 local_2f8;
  undefined1 local_198 [192];
  undefined1 local_d8 [192];
  
  local_478 = 0x6c756e2f7665642f;
  local_470 = 0x6c;
  puVar5 = local_350;
  pcStack_4a0 = (code *)0x17b8ea;
  uVar1 = uv_fs_open(0,puVar5,&local_478,2,0,0);
  iVar3 = (int)puVar5;
  if (uVar1 == 0xffffffff) {
    pcStack_4a0 = (code *)0x17baac;
    run_test_spawn_fs_open_cold_10();
LAB_0017baac:
    pcStack_4a0 = (code *)0x17bab1;
    run_test_spawn_fs_open_cold_1();
LAB_0017bab1:
    pcStack_4a0 = (code *)0x17bab6;
    run_test_spawn_fs_open_cold_2();
LAB_0017bab6:
    pcStack_4a0 = (code *)0x17babb;
    run_test_spawn_fs_open_cold_3();
LAB_0017babb:
    pcStack_4a0 = (code *)0x17bac0;
    run_test_spawn_fs_open_cold_4();
LAB_0017bac0:
    pcStack_4a0 = (code *)0x17bac5;
    run_test_spawn_fs_open_cold_5();
LAB_0017bac5:
    pcStack_4a0 = (code *)0x17baca;
    run_test_spawn_fs_open_cold_6();
LAB_0017baca:
    pcStack_4a0 = (code *)0x17bacf;
    run_test_spawn_fs_open_cold_7();
LAB_0017bacf:
    pcStack_4a0 = (code *)0x17bad4;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    unaff_RBX = (ulong)uVar1;
    pcStack_4a0 = (code *)0x17b906;
    local_490 = uv_get_osfhandle(local_2f8);
    pcStack_4a0 = (code *)0x17b912;
    uv_fs_req_cleanup(local_350);
    pcStack_4a0 = (code *)0x17b925;
    init_process_options("spawn_helper8",exit_cb);
    pcStack_4a0 = (code *)0x17b92a;
    uVar4 = uv_default_loop();
    pcStack_4a0 = (code *)0x17b93c;
    aVar6.stream = (uv_stream_t *)local_458;
    iVar2 = uv_pipe_init(uVar4,(uv_stream_t *)local_458,0);
    iVar3 = aVar6.fd;
    if (iVar2 != 0) goto LAB_0017baac;
    options.stdio = &local_468;
    local_468.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    pcStack_4a0 = (code *)0x17b974;
    local_468.data.stream = (uv_stream_t *)local_458;
    local_48c = dup(local_490);
    pcStack_4a0 = (code *)0x17b97d;
    uVar4 = uv_default_loop();
    iVar3 = 0x331810;
    pcStack_4a0 = (code *)0x17b98f;
    iVar2 = uv_spawn(uVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0017bab1;
    pcStack_4a0 = (code *)0x17b9a6;
    local_488 = uv_buf_init(&local_490,4);
    puVar5 = local_458;
    pcStack_4a0 = (code *)0x17b9d3;
    iVar2 = uv_write(local_d8,puVar5,local_488,1,write_null_cb);
    iVar3 = (int)puVar5;
    if (iVar2 != 0) goto LAB_0017bab6;
    pcStack_4a0 = (code *)0x17b9ea;
    auVar9 = uv_buf_init(&local_48c,4);
    puVar5 = local_458;
    pcStack_4a0 = (code *)0x17ba17;
    local_488 = auVar9;
    iVar2 = uv_write(local_198,puVar5,local_488,1,write_cb);
    iVar3 = (int)puVar5;
    if (iVar2 != 0) goto LAB_0017babb;
    pcStack_4a0 = (code *)0x17ba24;
    uVar4 = uv_default_loop();
    iVar3 = 0;
    pcStack_4a0 = (code *)0x17ba2e;
    iVar2 = uv_run(uVar4);
    if (iVar2 != 0) goto LAB_0017bac0;
    puVar5 = local_350;
    pcStack_4a0 = (code *)0x17ba49;
    iVar2 = uv_fs_close(0,puVar5,unaff_RBX,0);
    iVar3 = (int)puVar5;
    if (iVar2 != 0) goto LAB_0017bac5;
    if (exit_cb_called != 1) goto LAB_0017baca;
    if (close_cb_called != 2) goto LAB_0017bacf;
    pcStack_4a0 = (code *)0x17ba64;
    unaff_RBX = uv_default_loop();
    pcStack_4a0 = (code *)0x17ba78;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar3 = 0;
    pcStack_4a0 = (code *)0x17ba82;
    uv_run(unaff_RBX);
    pcStack_4a0 = (code *)0x17ba87;
    uVar4 = uv_default_loop();
    pcStack_4a0 = (code *)0x17ba8f;
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      pcStack_4a0 = (code *)0x17ba98;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStack_4a0 = write_null_cb;
  run_test_spawn_fs_open_cold_9();
  if (iVar3 == 0) {
    return extraout_EAX;
  }
  pcStack_4a8 = run_test_closed_fd_events;
  write_null_cb_cold_1();
  pcStack_4a8 = (code *)unaff_RBX;
  auStack_7b0._8_16_ = uv_buf_init("");
  tcp = (uv_process_t *)auStack_7b0;
  nread = (code *)0x0;
  iVar3 = uv_pipe(tcp,0,0);
  if (iVar3 == 0) {
    if ((int)auStack_7b0._0_4_ < 3) goto LAB_0017bdc8;
    if ((int)auStack_7b0._4_4_ < 3) goto LAB_0017bdcd;
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_798;
    uStack_798.flags = UV_INHERIT_FD;
    uStack_798.data.fd = auStack_7b0._0_4_;
    uStack_788 = 0;
    uStack_778 = 0;
    tcp = (uv_process_t *)uv_default_loop();
    puVar7 = &process;
    iVar3 = uv_spawn(tcp,&process,&options);
    nread = (code *)puVar7;
    if (iVar3 != 0) goto LAB_0017bdd2;
    uv_unref(&process);
    tcp = (uv_process_t *)uv_default_loop();
    nread = (code *)&uStack_768;
    iVar3 = uv_pipe_init(tcp,nread,0);
    if (iVar3 != 0) goto LAB_0017bdd7;
    nread = (code *)(ulong)(uint)auStack_7b0._0_4_;
    tcp = (uv_process_t *)&uStack_768;
    iVar3 = uv_pipe_open();
    if (iVar3 != 0) goto LAB_0017bddc;
    auStack_7b0._0_4_ = 0xffffffff;
    nread = on_alloc;
    tcp = (uv_process_t *)&uStack_768;
    iVar3 = uv_read_start(tcp,on_alloc,on_read_once);
    if (iVar3 != 0) goto LAB_0017bde1;
    nread = (code *)&uStack_660;
    tcp = (uv_process_t *)0x0;
    iVar3 = uv_fs_write(0,nread,auStack_7b0._4_4_,auStack_7b0 + 8,1,0xffffffffffffffff,0);
    if (iVar3 != 1) goto LAB_0017bde6;
    if (uStack_660._88_8_ != 1) goto LAB_0017bdeb;
    uv_fs_req_cleanup(&uStack_660);
    tcp = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar3 = uv_run();
    if (iVar3 != 0) goto LAB_0017bdf0;
    if (output_used != 1) goto LAB_0017bdf5;
    uv_close(&uStack_768,close_cb);
    nread = (code *)&uStack_660;
    tcp = (uv_process_t *)0x0;
    iVar3 = uv_fs_write(0,nread,auStack_7b0._4_4_,auStack_7b0 + 8,1,0xffffffffffffffff,0);
    if (iVar3 != 1) goto LAB_0017bdfa;
    if (uStack_660._88_8_ != 1) goto LAB_0017bdff;
    uv_fs_req_cleanup(&uStack_660);
    tcp = (uv_process_t *)uv_default_loop();
    puVar8 = &timer;
    iVar3 = uv_timer_init();
    nread = (code *)puVar8;
    if (iVar3 != 0) goto LAB_0017be04;
    puVar8 = &timer;
    nread = timer_counter_cb;
    iVar3 = uv_timer_start(&timer,timer_counter_cb,10,0);
    tcp = (uv_process_t *)puVar8;
    if (iVar3 != 0) goto LAB_0017be09;
    tcp = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar3 = uv_run();
    if (iVar3 == 1) {
      tcp = (uv_process_t *)uv_default_loop();
      nread = (code *)0x1;
      iVar3 = uv_run();
      if (iVar3 != 0) goto LAB_0017be22;
    }
    if (timer_counter != 1) goto LAB_0017be0e;
    tcp = &process;
    nread = (code *)0xf;
    iVar3 = uv_process_kill();
    if (iVar3 != 0) goto LAB_0017be13;
    tcp = (uv_process_t *)(ulong)(uint)auStack_7b0._4_4_;
    iVar3 = close(auStack_7b0._4_4_);
    if (iVar3 != 0) goto LAB_0017be18;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    nread = (code *)0x0;
    uv_run(uVar4);
    tcp = (uv_process_t *)uv_default_loop();
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0017bdc8:
    run_test_closed_fd_events_cold_2();
LAB_0017bdcd:
    run_test_closed_fd_events_cold_3();
LAB_0017bdd2:
    run_test_closed_fd_events_cold_4();
LAB_0017bdd7:
    run_test_closed_fd_events_cold_5();
LAB_0017bddc:
    run_test_closed_fd_events_cold_6();
LAB_0017bde1:
    run_test_closed_fd_events_cold_7();
LAB_0017bde6:
    run_test_closed_fd_events_cold_8();
LAB_0017bdeb:
    run_test_closed_fd_events_cold_9();
LAB_0017bdf0:
    run_test_closed_fd_events_cold_10();
LAB_0017bdf5:
    run_test_closed_fd_events_cold_11();
LAB_0017bdfa:
    run_test_closed_fd_events_cold_12();
LAB_0017bdff:
    run_test_closed_fd_events_cold_13();
LAB_0017be04:
    run_test_closed_fd_events_cold_14();
LAB_0017be09:
    run_test_closed_fd_events_cold_15();
LAB_0017be0e:
    run_test_closed_fd_events_cold_17();
LAB_0017be13:
    run_test_closed_fd_events_cold_18();
LAB_0017be18:
    run_test_closed_fd_events_cold_19();
  }
  run_test_closed_fd_events_cold_20();
LAB_0017be22:
  run_test_closed_fd_events_cold_16();
  uv_read_stop();
  on_read((uv_stream_t *)tcp,(ssize_t)nread,buf);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int r;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_write_t write_req2;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];
#ifdef _WIN32
  const char dev_null[] = "NUL";
  HMODULE kernelbase_module;
  sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#else
  const char dev_null[] = "/dev/null";
#endif

  r = uv_fs_open(NULL, &fs_req, dev_null, O_RDWR, 0, NULL);
  ASSERT(r != -1);
  fd = uv_get_osfhandle((uv_file) fs_req.result);
  uv_fs_req_cleanup(&fs_req);

  init_process_options("spawn_helper8", exit_cb);

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  /* make an inheritable copy */
#ifdef _WIN32
  ASSERT(0 != DuplicateHandle(GetCurrentProcess(), fd, GetCurrentProcess(), &dup_fd,
                              0, /* inherit */ TRUE, DUPLICATE_SAME_ACCESS));
  kernelbase_module = GetModuleHandleA("kernelbase.dll");
  pCompareObjectHandles = (sCompareObjectHandles)
      GetProcAddress(kernelbase_module, "CompareObjectHandles");
  ASSERT(pCompareObjectHandles == NULL || pCompareObjectHandles(fd, dup_fd));
#else
  dup_fd = dup(fd);
#endif

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_null_cb));

  buf = uv_buf_init((char*) &dup_fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_fs_close(NULL, &fs_req, r, NULL));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY();
  return 0;
}